

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

int wiz_show_stats(void)

{
  undefined4 *puVar1;
  nh_menuitem *_item__12;
  nh_menuitem *_item__11;
  nh_menuitem *_item__10;
  nh_menuitem *_item__9;
  nh_menuitem *_item__8;
  nh_menuitem *_item__7;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  long total_mon_count;
  long total_mon_size;
  long total_obj_count;
  long total_obj_size;
  menulist menu;
  char buf [256];
  
  total_obj_count = 0;
  total_mon_size = 0;
  total_mon_count = 0;
  _item_ = (nh_menuitem *)0x0;
  init_menulist((menulist *)&total_obj_size);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"Current memory statistics:");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sprintf((char *)&menu.size,"Objects, size %d",0x68);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),(char *)&menu.size);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"                   count  bytes");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  obj_chain((menulist *)&total_obj_size,"invent",invent,&total_mon_size,&total_obj_count);
  obj_chain((menulist *)&total_obj_size,"level->objlist",level->objlist,&total_mon_size,
            &total_obj_count);
  obj_chain((menulist *)&total_obj_size,"buried",level->buriedobjlist,&total_mon_size,
            &total_obj_count);
  obj_chain((menulist *)&total_obj_size,"magic chest obj",magic_chest_objs,&total_mon_size,
            &total_obj_count);
  mon_invent_chain((menulist *)&total_obj_size,"minvent",level->monlist,&total_mon_size,
                   &total_obj_count);
  mon_invent_chain((menulist *)&total_obj_size,"migrating minvent",migrating_mons,&total_mon_size,
                   &total_obj_count);
  contained((menulist *)&total_obj_size,"contained",&total_mon_size,&total_obj_count);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"------------------ -----  ------");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sprintf((char *)&menu.size,"%-18s %4ld  %6ld","Total",total_mon_size,total_obj_count);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),(char *)&menu.size);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sprintf((char *)&menu.size,"Monsters, size %d",0x78);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),(char *)&menu.size);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  mon_chain((menulist *)&total_obj_size,"level->monlist",level->monlist,(long *)&_item_,
            &total_mon_count);
  mon_chain((menulist *)&total_obj_size,"migrating",migrating_mons,(long *)&_item_,&total_mon_count)
  ;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),"------------------ -----  ------");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sprintf((char *)&menu.size,"%-18s %4ld  %6ld","Total",_item_,total_mon_count);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    total_obj_size = (long)realloc((void *)total_obj_size,(long)(int)menu.items * 0x10c);
  }
  puVar1 = (undefined4 *)(total_obj_size + (long)menu.items._4_4_ * 0x10c);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 0x42) = 0;
  *(undefined1 *)((long)puVar1 + 0x109) = 0;
  *(undefined1 *)((long)puVar1 + 0x10a) = 0;
  strcpy((char *)(puVar1 + 2),(char *)&menu.size);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  display_menu((nh_menuitem *)total_obj_size,menu.items._4_4_,(char *)0x0,0,(int *)0x0);
  free((void *)total_obj_size);
  return 0;
}

Assistant:

static int wiz_show_stats(void)
{
	char buf[BUFSZ];
	struct menulist menu;
	long total_obj_size = 0, total_obj_count = 0;
	long total_mon_size = 0, total_mon_count = 0;

	init_menulist(&menu);
	add_menutext(&menu, "Current memory statistics:");
	add_menutext(&menu, "");
	sprintf(buf, "Objects, size %d", (int) sizeof(struct obj));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");
	add_menutext(&menu, count_str);

	obj_chain(&menu, "invent", invent, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "level->objlist", level->objlist, &total_obj_count, &total_obj_size);
	obj_chain(&menu, "buried", level->buriedobjlist,
				&total_obj_count, &total_obj_size);
	obj_chain(&menu, "magic chest obj", magic_chest_objs,
				&total_obj_count, &total_obj_size);
	mon_invent_chain(&menu, "minvent", level->monlist,
				&total_obj_count,&total_obj_size);
	mon_invent_chain(&menu, "migrating minvent", migrating_mons,
				&total_obj_count, &total_obj_size);

	contained(&menu, "contained",
				&total_obj_count, &total_obj_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_obj_count, total_obj_size);
	add_menutext(&menu, buf);

	add_menutext(&menu, "");
	add_menutext(&menu, "");
	sprintf(buf, "Monsters, size %d", (int) sizeof(struct monst));
	add_menutext(&menu, buf);
	add_menutext(&menu, "");

	mon_chain(&menu, "level->monlist", level->monlist,
				&total_mon_count, &total_mon_size);
	mon_chain(&menu, "migrating", migrating_mons,
				&total_mon_count, &total_mon_size);

	add_menutext(&menu, separator);
	sprintf(buf, template, "Total", total_mon_count, total_mon_size);
	add_menutext(&menu, buf);

	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
	free(menu.items);
	return 0;
}